

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum.pb.cc
# Opt level: O0

void proto3_preserve_unknown_enum_unittest::MyMessage::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  MyEnum MVar4;
  MyMessage **v1;
  MyMessage **v2;
  char *failure_msg;
  LogMessage *pLVar5;
  RepeatedField<int> *pRVar6;
  RepeatedField<int> *pRVar7;
  uint32_t *puVar8;
  bool oneof_needs_init;
  uint32_t oneof_to_case;
  uint32_t oneof_from_case;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  MyMessage *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  MyMessage *from;
  MyMessage *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (MyMessage *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (MyMessage *)to_msg;
  _this = (MyMessage *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto3_preserve_unknown_enum_unittest::MyMessage_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto3_preserve_unknown_enum_unittest::MyMessage*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto3_preserve_unknown_enum_unittest::MyMessage_const*,proto3_preserve_unknown_enum_unittest::MyMessage*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    pRVar6 = _internal_mutable_repeated_e(from);
    pRVar7 = _internal_repeated_e((MyMessage *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
    pRVar6 = _internal_mutable_repeated_packed_e(from);
    pRVar7 = _internal_repeated_packed_e((MyMessage *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
    pRVar6 = _internal_mutable_repeated_packed_unexpected_e(from);
    pRVar7 = _internal_repeated_packed_unexpected_e((MyMessage *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
    puVar8 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    uVar1 = *puVar8;
    if (((uVar1 & 1) != 0) &&
       (MVar4 = _internal_e((MyMessage *)absl_log_internal_check_op_result), MVar4 != FOO)) {
      (from->field_0)._impl_.e_ = *(int *)(absl_log_internal_check_op_result + 0x5c);
    }
    puVar8 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar8 = uVar1 | *puVar8;
    uVar2 = *(uint32_t *)(absl_log_internal_check_op_result + 100);
    if (uVar2 != 0) {
      uVar3 = (from->field_0)._impl_._oneof_case_[0];
      if (uVar3 != uVar2) {
        if (uVar3 != 0) {
          clear_o(from);
        }
        (from->field_0)._impl_._oneof_case_[0] = uVar2;
      }
      if (uVar2 != 0) {
        if (uVar2 == 5) {
          (from->field_0)._impl_.o_ = *(OUnion *)(absl_log_internal_check_op_result + 0x60);
        }
        else if (uVar2 == 6) {
          (from->field_0)._impl_.o_ = *(OUnion *)(absl_log_internal_check_op_result + 0x60);
        }
      }
    }
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_preserve_unknown_enum.pb.cc"
             ,0x25c,failure_msg);
  pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar5);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void MyMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<MyMessage*>(&to_msg);
  auto& from = static_cast<const MyMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_preserve_unknown_enum_unittest.MyMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_e()->MergeFrom(from._internal_repeated_e());
  _this->_internal_mutable_repeated_packed_e()->MergeFrom(from._internal_repeated_packed_e());
  _this->_internal_mutable_repeated_packed_unexpected_e()->MergeFrom(from._internal_repeated_packed_unexpected_e());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (from._internal_e() != 0) {
      _this->_impl_.e_ = from._impl_.e_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_o();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofE1: {
        _this->_impl_.o_.oneof_e_1_ = from._impl_.o_.oneof_e_1_;
        break;
      }
      case kOneofE2: {
        _this->_impl_.o_.oneof_e_2_ = from._impl_.o_.oneof_e_2_;
        break;
      }
      case O_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}